

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_timer_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t h;
  undefined1 auStack_118 [120];
  code *pcStack_a0;
  long local_90;
  long local_88;
  undefined1 local_80 [120];
  
  pcStack_a0 = (code *)0x1b8e92;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1b8ea2;
  uv_timer_init(uVar2,local_80);
  pcStack_a0 = (code *)0x1b8eaa;
  uv_unref(local_80);
  pcStack_a0 = (code *)0x1b8eaf;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1b8eb9;
  uv_run(uVar2,0);
  pcStack_a0 = (code *)0x1b8ec1;
  do_close(local_80);
  pcStack_a0 = (code *)0x1b8ec6;
  uVar2 = uv_default_loop();
  pcStack_a0 = (code *)0x1b8eda;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_a0 = (code *)0x1b8ee4;
  uv_run(uVar2,0);
  local_88 = 0;
  pcStack_a0 = (code *)0x1b8ef2;
  uVar3 = uv_default_loop();
  pcStack_a0 = (code *)0x1b8efa;
  iVar1 = uv_loop_close(uVar3);
  local_90 = (long)iVar1;
  if (local_88 == local_90) {
    pcStack_a0 = (code *)0x1b8f12;
    uv_library_shutdown();
    return 0;
  }
  pcStack_a0 = run_test_timer_ref2;
  run_test_timer_ref_cold_1();
  pcStack_a0 = (code *)uVar2;
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,auStack_118);
  uv_timer_start(auStack_118,fail_cb,0x2a,0x2a);
  uv_unref(auStack_118);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(auStack_118);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    uv_library_shutdown();
    return 0;
  }
  run_test_timer_ref2_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,0x39,"fail_cb should not have been called",in_R9,uVar2);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(timer_ref) {
  uv_timer_t h;
  uv_timer_init(uv_default_loop(), &h);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}